

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O0

IXML_Node_conflict * ixmlNamedNodeMap_item(IXML_NamedNodeMap *nnMap,unsigned_long index)

{
  unsigned_long uVar1;
  uint local_2c;
  IXML_Node_conflict *pIStack_28;
  uint i;
  IXML_Node_conflict *tempNode;
  unsigned_long index_local;
  IXML_NamedNodeMap *nnMap_local;
  
  if (nnMap == (IXML_NamedNodeMap *)0x0) {
    nnMap_local = (IXML_NamedNodeMap *)0x0;
  }
  else {
    uVar1 = ixmlNamedNodeMap_getLength(nnMap);
    if (uVar1 - 1 < index) {
      nnMap_local = (IXML_NamedNodeMap *)0x0;
    }
    else {
      pIStack_28 = nnMap->nodeItem;
      for (local_2c = 0; local_2c < index && pIStack_28 != (IXML_Node_conflict *)0x0;
          local_2c = local_2c + 1) {
        pIStack_28 = pIStack_28->nextSibling;
      }
      nnMap_local = (IXML_NamedNodeMap *)pIStack_28;
    }
  }
  return (IXML_Node_conflict *)nnMap_local;
}

Assistant:

IXML_Node *ixmlNamedNodeMap_item(
	/* IN */ IXML_NamedNodeMap *nnMap,
	/* IN */ unsigned long index)
{
	IXML_Node *tempNode;
	unsigned int i;

	if (nnMap == NULL) {
		return NULL;
	}

	if (index > ixmlNamedNodeMap_getLength(nnMap) - 1lu) {
		return NULL;
	}

	tempNode = nnMap->nodeItem;
	for (i = 0u; i < index && tempNode != NULL; ++i) {
		tempNode = tempNode->nextSibling;
	}

	return tempNode;
}